

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void reg_push(lgx_compiler_t *c,lgx_ast_node_t *node,uchar reg)

{
  for (; (c != (lgx_compiler_t *)0x0 && (*(char *)&c->ast != '\x18'));
      c = *(lgx_compiler_t **)&c->bc) {
  }
  if (c != (lgx_compiler_t *)0x0) {
    lgx_reg_push((lgx_reg_t *)(c->constant).tail,(uchar)node);
    return;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/compiler/compiler.c"
                ,0x45,"void reg_push(lgx_compiler_t *, lgx_ast_node_t *, unsigned char)");
}

Assistant:

static void reg_push(lgx_compiler_t* c, lgx_ast_node_t *node, unsigned char reg) {
    node = find_function(node);
    assert(node);

    lgx_reg_push(node->u.regs, reg);
}